

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

size_t create_circuit(ect *e,uint64_t max_label,uint64_t eliminations)

{
  ulong uVar1;
  uint uVar2;
  direction *pdVar3;
  ect *peVar4;
  v_array<direction> *pvVar5;
  uint uVar6;
  long lVar7;
  v_array<v_array<unsigned_int>_> *pvVar8;
  uint *puVar9;
  size_t sVar10;
  uint *puVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint **ppuVar15;
  v_array<unsigned_int> *pvVar16;
  uint *puVar17;
  ulong uVar18;
  v_array<v_array<v_array<unsigned_int>_>_> *this;
  bool bVar19;
  uint32_t id;
  v_array<v_array<unsigned_int>_> tournaments;
  direction d;
  v_array<v_array<unsigned_int>_> new_tournaments;
  v_array<unsigned_int> t;
  uint local_124;
  ect *local_120;
  v_array<v_array<unsigned_int>_> local_118;
  uint *local_f0;
  undefined1 local_e8 [24];
  undefined8 uStack_d0;
  ulong local_c8;
  uint local_c0;
  uint local_bc;
  v_array<v_array<unsigned_int>_> local_b8;
  long local_98;
  uint64_t local_90;
  v_array<direction> *local_88;
  uint64_t local_80;
  v_array<v_array<v_array<unsigned_int>_>_> *local_78;
  long local_70;
  v_array<unsigned_int> *local_68;
  ulong local_60;
  v_array<unsigned_int> local_58;
  
  if (max_label == 1) {
    return 0;
  }
  local_118.end_array = (v_array<unsigned_int> *)0x0;
  local_118.erase_count = 0;
  local_118._begin = (v_array<unsigned_int> *)0x0;
  local_118._end = (v_array<unsigned_int> *)0x0;
  local_58.end_array = (uint *)0x0;
  local_58.erase_count = 0;
  local_58._begin = (uint *)0x0;
  local_58._end = (uint *)0x0;
  local_b8._begin = (v_array<unsigned_int> *)((ulong)local_b8._begin & 0xffffffff00000000);
  local_120 = e;
  local_90 = eliminations;
  if (max_label != 0) {
    do {
      v_array<unsigned_int>::push_back(&local_58,(uint *)&local_b8);
      local_e8._8_8_ = (uint *)0x0;
      local_e8._16_8_ = (uint *)0x0;
      uStack_d0 = 0;
      local_e8._0_8_ = (ulong)local_b8._begin & 0xffffffff;
      local_c8 = 0;
      v_array<direction>::push_back(&e->directions,(direction *)local_e8);
      uVar6 = (int)local_b8._begin + 1;
      local_b8._begin = (v_array<unsigned_int> *)CONCAT44(local_b8._begin._4_4_,uVar6);
    } while (uVar6 < max_label);
  }
  local_80 = max_label;
  v_array<v_array<unsigned_int>_>::push_back(&local_118,&local_58);
  lVar7 = local_90 - 1;
  local_98 = lVar7;
  if (lVar7 != 0) {
    do {
      local_e8._16_8_ = (uint *)0x0;
      uStack_d0 = 0;
      local_e8._0_8_ = (uint *)0x0;
      local_e8._8_8_ = (uint *)0x0;
      v_array<v_array<unsigned_int>_>::push_back(&local_118,(v_array<unsigned_int> *)local_e8);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  peVar4 = local_120;
  this = &local_120->all_levels;
  v_array<v_array<v_array<unsigned_int>_>_>::push_back(this,&local_118);
  local_88 = &peVar4->directions;
  uVar6 = (int)((ulong)((long)(peVar4->directions)._end - (long)(peVar4->directions)._begin) >> 3) *
          -0x33333333;
  local_68 = &peVar4->final_nodes;
  lVar7 = 0;
  local_78 = this;
  do {
    pvVar8 = this->_begin;
    pvVar16 = pvVar8[lVar7]._begin;
    lVar12 = (long)pvVar8[lVar7]._end - (long)pvVar16;
    bVar19 = lVar12 != 0;
    if (lVar12 == 0) {
LAB_0023d242:
      if (!bVar19) {
        local_120->last_pair = (int)local_90 * ((int)local_80 + -1);
        if (local_80 != 0) {
          sVar10 = final_depth(local_90);
          local_120->tree_height = sVar10;
        }
        return local_98 + (ulong)local_120->last_pair;
      }
    }
    else {
      uVar13 = lVar12 >> 5;
      if (pvVar16->_end == pvVar16->_begin) {
        ppuVar15 = &pvVar16[1]._end;
        uVar1 = 1;
        do {
          uVar18 = uVar1;
          if (uVar13 + (uVar13 == 0) == uVar18) break;
          puVar17 = *ppuVar15;
          pvVar16 = (v_array<unsigned_int> *)(ppuVar15 + -1);
          ppuVar15 = ppuVar15 + 4;
          uVar1 = uVar18 + 1;
        } while (puVar17 == pvVar16->_begin);
        bVar19 = uVar18 < uVar13;
        goto LAB_0023d242;
      }
    }
    pvVar8 = pvVar8 + lVar7;
    local_b8.end_array = (v_array<unsigned_int> *)0x0;
    local_b8.erase_count = 0;
    local_b8._begin = (v_array<unsigned_int> *)0x0;
    local_b8._end = (v_array<unsigned_int> *)0x0;
    local_118._begin = pvVar8->_begin;
    local_118._end = pvVar8->_end;
    local_118.end_array = pvVar8->end_array;
    local_118.erase_count = pvVar8->erase_count;
    if (local_118._end != local_118._begin) {
      uVar13 = 0;
      do {
        local_e8._16_8_ = (uint *)0x0;
        uStack_d0 = 0;
        local_e8._0_8_ = (uint *)0x0;
        local_e8._8_8_ = (uint *)0x0;
        v_array<v_array<unsigned_int>_>::push_back(&local_b8,(v_array<unsigned_int> *)local_e8);
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)((long)local_118._end - (long)local_118._begin >> 5));
    }
    local_70 = lVar7;
    if (local_118._end != local_118._begin) {
      puVar17 = (uint *)0x0;
      do {
        puVar11 = local_118._begin[(long)puVar17]._begin;
        puVar9 = local_118._begin[(long)puVar17]._end;
        uVar13 = (long)puVar9 - (long)puVar11;
        local_f0 = puVar17;
        if (4 < uVar13) {
          uVar1 = (long)puVar17 + 1;
          local_60 = (ulong)uVar6;
          uVar18 = 0;
          local_c0 = uVar6;
          do {
            local_124 = (int)local_60 + (int)uVar18;
            uVar6 = puVar11[uVar18 * 2];
            uVar2 = puVar11[uVar18 * 2 + 1];
            local_e8._0_8_ = ZEXT48(local_124);
            local_e8._16_8_ = (uint *)0x0;
            uStack_d0 = CONCAT44(uVar2,uVar6);
            local_c8 = local_c8 & 0xffffffffffffff00;
            local_e8._8_8_ = local_f0;
            v_array<direction>::push_back(local_88,(direction *)local_e8);
            pvVar5 = local_88;
            pdVar3 = (local_120->directions)._begin;
            uVar14 = (int)((ulong)((long)(local_120->directions)._end - (long)pdVar3) >> 3) *
                     -0x33333333 - 1;
            if ((uint *)pdVar3[uVar6].tournament == local_f0) {
              pdVar3[uVar6].winner = uVar14;
            }
            else {
              pdVar3[uVar6].loser = uVar14;
            }
            pdVar3 = local_88->_begin;
            if ((uint *)pdVar3[uVar2].tournament == local_f0) {
              pdVar3[uVar2].winner = uVar14;
            }
            else {
              pdVar3[uVar2].loser = uVar14;
            }
            if (local_88->_begin[uVar6].last == true) {
              local_88->_begin[uVar6].winner = uVar14;
            }
            if (((long)local_118._begin[(long)puVar17]._end -
                 (long)local_118._begin[(long)puVar17]._begin == 8) &&
               ((local_f0 == (uint *)0x0 ||
                (local_118._begin[(long)puVar17 - 1]._end ==
                 local_118._begin[(long)puVar17 - 1]._begin)))) {
              local_88->_begin[uVar14].last = true;
              if (uVar1 < (ulong)((long)local_118._end - (long)local_118._begin >> 5)) {
                v_array<unsigned_int>::push_back(local_b8._begin + uVar1,&local_124);
              }
              else {
                local_88->_begin[uVar14].winner = 0;
              }
              local_bc = (int)((ulong)((long)(local_120->directions)._end -
                                      (long)(local_120->directions)._begin) >> 3) * -0x33333333 - 1;
              puVar11 = &local_bc;
              pvVar16 = local_68;
            }
            else {
              puVar11 = &local_124;
              pvVar16 = local_b8._begin + (long)puVar17;
            }
            v_array<unsigned_int>::push_back(pvVar16,puVar11);
            if (uVar1 < (ulong)((long)local_118._end - (long)local_118._begin >> 5)) {
              v_array<unsigned_int>::push_back(local_b8._begin + uVar1,&local_124);
            }
            else {
              pvVar5->_begin[uVar14].loser = 0;
            }
            uVar18 = uVar18 + 1;
            puVar11 = local_118._begin[(long)puVar17]._begin;
            puVar9 = local_118._begin[(long)puVar17]._end;
            uVar13 = (long)puVar9 - (long)puVar11;
          } while (uVar18 < (ulong)((long)uVar13 >> 2) >> 1);
          uVar6 = local_c0 + (int)uVar18;
        }
        if ((uVar13 & 4) != 0) {
          local_e8._0_4_ = puVar9[-1];
          v_array<unsigned_int>::push_back(local_b8._begin + (long)puVar17,(uint *)local_e8);
        }
        puVar17 = (uint *)((long)local_f0 + 1);
      } while (puVar17 < (uint *)((long)local_118._end - (long)local_118._begin >> 5));
    }
    this = local_78;
    v_array<v_array<v_array<unsigned_int>_>_>::push_back(local_78,&local_b8);
    lVar7 = local_70 + 1;
  } while( true );
}

Assistant:

size_t create_circuit(ect& e, uint64_t max_label, uint64_t eliminations)
{
  if (max_label == 1)
    return 0;

  v_array<v_array<uint32_t>> tournaments = v_init<v_array<uint32_t>>();
  v_array<uint32_t> t = v_init<uint32_t>();

  for (uint32_t i = 0; i < max_label; i++)
  {
    t.push_back(i);
    direction d = {i, 0, 0, 0, 0, 0, false};
    e.directions.push_back(d);
  }

  tournaments.push_back(t);

  for (size_t i = 0; i < eliminations - 1; i++) tournaments.push_back(v_array<uint32_t>());

  e.all_levels.push_back(tournaments);

  size_t level = 0;

  uint32_t node = (uint32_t)e.directions.size();

  while (not_empty(e.all_levels[level]))
  {
    v_array<v_array<uint32_t>> new_tournaments = v_init<v_array<uint32_t>>();
    tournaments = e.all_levels[level];

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      v_array<uint32_t> empty = v_init<uint32_t>();
      new_tournaments.push_back(empty);
    }

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      for (size_t j = 0; j < tournaments[t].size() / 2; j++)
      {
        uint32_t id = node++;
        uint32_t left = tournaments[t][2 * j];
        uint32_t right = tournaments[t][2 * j + 1];

        direction d = {id, t, 0, 0, left, right, false};
        e.directions.push_back(d);
        uint32_t direction_index = (uint32_t)e.directions.size() - 1;
        if (e.directions[left].tournament == t)
          e.directions[left].winner = direction_index;
        else
          e.directions[left].loser = direction_index;
        if (e.directions[right].tournament == t)
          e.directions[right].winner = direction_index;
        else
          e.directions[right].loser = direction_index;
        if (e.directions[left].last == true)
          e.directions[left].winner = direction_index;

        if (tournaments[t].size() == 2 && (t == 0 || tournaments[t - 1].size() == 0))
        {
          e.directions[direction_index].last = true;
          if (t + 1 < tournaments.size())
            new_tournaments[t + 1].push_back(id);
          else  // winner eliminated.
            e.directions[direction_index].winner = 0;
          e.final_nodes.push_back((uint32_t)(e.directions.size() - 1));
        }
        else
          new_tournaments[t].push_back(id);
        if (t + 1 < tournaments.size())
          new_tournaments[t + 1].push_back(id);
        else  // loser eliminated.
          e.directions[direction_index].loser = 0;
      }
      if (tournaments[t].size() % 2 == 1)
        new_tournaments[t].push_back(tournaments[t].last());
    }
    e.all_levels.push_back(new_tournaments);
    level++;
  }

  e.last_pair = (uint32_t)((max_label - 1) * eliminations);

  if (max_label > 1)
    e.tree_height = final_depth(eliminations);

  return e.last_pair + (eliminations - 1);
}